

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::torrent::prioritize_piece_list
          (torrent *this,
          vector<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>,_std::allocator<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
          *pieces)

{
  download_priority_t new_piece_priority;
  piece_index_t index;
  pointer ppVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>
  *p;
  pointer ppVar5;
  
  bVar2 = is_seed(this);
  if (bVar2) {
    return;
  }
  need_picker(this);
  bVar2 = is_finished(this);
  ppVar5 = (pieces->
           super__Vector_base<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>,_std::allocator<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (pieces->
           super__Vector_base<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>,_std::allocator<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar5 == ppVar1) {
    update_gauge(this);
  }
  else {
    bVar4 = 0;
    do {
      index.m_val = (ppVar5->first).m_val;
      if (((-1 < index.m_val) &&
          (index.m_val <
           (((this->super_torrent_hot_members).m_torrent_file.
             super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           m_files).m_num_pieces)) &&
         (new_piece_priority.m_val = (ppVar5->second).m_val, new_piece_priority.m_val < 8)) {
        bVar3 = piece_picker::set_piece_priority
                          ((this->super_torrent_hot_members).m_picker._M_t.
                           super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                           .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                           _M_head_impl,index,new_piece_priority);
        bVar4 = bVar4 | bVar3;
      }
      ppVar5 = ppVar5 + 1;
    } while (ppVar5 != ppVar1);
    update_gauge(this);
    if (bVar4 != 0) {
      bVar4 = (this->m_need_save_resume_data).m_val;
      if ((bVar4 & 0x20) == 0) {
        (this->m_need_save_resume_data).m_val = bVar4 | 0x20;
        state_updated(this);
      }
      update_peer_interest(this,bVar2);
    }
  }
  state_updated(this);
  return;
}

Assistant:

void torrent::prioritize_piece_list(std::vector<std::pair<piece_index_t
		, download_priority_t>> const& pieces)
	{
		INVARIANT_CHECK;

		// this call is only valid on torrents with metadata
		TORRENT_ASSERT(valid_metadata());
		if (is_seed()) return;

		need_picker();

		bool filter_updated = false;
		bool const was_finished = is_finished();
		for (auto const& p : pieces)
		{
			static_assert(std::is_unsigned<decltype(p.second)::underlying_type>::value
				, "we need assert p.second >= dont_download");
			TORRENT_ASSERT(p.second <= top_priority);
			TORRENT_ASSERT(p.first >= piece_index_t(0));
			TORRENT_ASSERT(p.first < m_torrent_file->end_piece());

			if (p.first < piece_index_t(0)
				|| p.first >= m_torrent_file->end_piece()
				|| p.second > top_priority)
			{
				static_assert(std::is_unsigned<decltype(p.second)::underlying_type>::value
					, "we need additional condition: p.second < dont_download");
				continue;
			}

			filter_updated |= m_picker->set_piece_priority(p.first, p.second);
		}
		update_gauge();
		if (filter_updated)
		{
			// we need to save this new state
			set_need_save_resume(torrent_handle::if_config_changed);

			update_peer_interest(was_finished);
		}

		state_updated();
	}